

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString * __thiscall SimpleString::operator+=(SimpleString *this,char *rhs)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  size_t n_1;
  long lVar4;
  long lVar5;
  size_t n;
  long lVar6;
  
  lVar6 = -1;
  lVar5 = 0;
  pcVar3 = this->buffer_;
  do {
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 1;
    cVar2 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while (cVar2 != '\0');
  lVar4 = -1;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while (rhs[lVar1] != '\0');
  pcVar3 = copyToNewBuffer(this->buffer_,lVar5 + lVar4);
  if (lVar4 != -1 && pcVar3 != (char *)0x0) {
    cVar2 = *rhs;
    pcVar3[lVar6] = cVar2;
    if (lVar4 != 0) {
      lVar6 = 0;
      do {
        if (cVar2 == '\0') break;
        cVar2 = rhs[lVar6 + 1];
        pcVar3[lVar6 + lVar5] = cVar2;
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
  }
  deallocateInternalBuffer(this);
  this->bufferSize_ = lVar5 + lVar4;
  this->buffer_ = pcVar3;
  return this;
}

Assistant:

SimpleString& SimpleString::operator+=(const char* rhs)
{
    size_t originalSize = this->size();
    size_t additionalStringSize = StrLen(rhs) + 1;
    size_t sizeOfNewString = originalSize + additionalStringSize;
    char* tbuffer = copyToNewBuffer(this->getBuffer(), sizeOfNewString);
    StrNCpy(tbuffer + originalSize, rhs, additionalStringSize);

    setInternalBufferTo(tbuffer, sizeOfNewString);
    return *this;
}